

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::ProcessLayer(NeuralNetworkShaper *this,NeuralNetworkLayer *layer)

{
  LayerCase LVar1;
  runtime_error *prVar2;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkShaper *this_local;
  
  LVar1 = Specification::NeuralNetworkLayer::layer_case(layer);
  if (LVar1 == LAYER_NOT_SET) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Layer type not found.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (LVar1 == kConvolution) {
    shapeConvolutionLayer(this,layer);
  }
  else if (LVar1 == kPooling) {
    shapePoolingLayer(this,layer);
  }
  else if (LVar1 == kActivation) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kInnerProduct) {
    shapeInnerProductLayer(this,layer);
  }
  else if (LVar1 == kEmbedding) {
    shapeEmbeddingLayer(this,layer);
  }
  else if (LVar1 == kBatchnorm) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kMvn) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kL2Normalize) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kSoftmax) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kLrn) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kCrop) {
    shapeCropLayer(this,layer);
  }
  else if (LVar1 == kPadding) {
    shapePaddingLayer(this,layer);
  }
  else if (LVar1 == kUpsample) {
    shapeUpsampleLayer(this,layer);
  }
  else if (LVar1 == kResizeBilinear) {
    shapeResizeBilinearLayer(this,layer);
  }
  else if (LVar1 == kCropResize) {
    shapeCropResizeLayer(this,layer);
  }
  else if (LVar1 == kUnary) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kAdd) {
    shapeBroadcastLayer(this,layer);
  }
  else if (LVar1 == kMultiply) {
    shapeBroadcastLayer(this,layer);
  }
  else if (LVar1 == kAverage) {
    shapeBroadcastLayer(this,layer);
  }
  else if (LVar1 == kScale) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kBias) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kMax) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kMin) {
    shapeUnchanged(this,layer);
  }
  else if (LVar1 == kDot) {
    shapeDotLayer(this,layer);
  }
  else if (LVar1 == kReduce) {
    shapeReduceLayer(this,layer);
  }
  else if (LVar1 == kLoadConstant) {
    shapeLoadConstantLayer(this,layer);
  }
  else if (LVar1 == kReshape) {
    shapeReshapeLayer(this,layer);
  }
  else if (LVar1 == kFlatten) {
    shapeFlattenLayer(this,layer);
  }
  else if (LVar1 == kPermute) {
    shapePermuteLayer(this,layer);
  }
  else if (LVar1 == kConcat) {
    shapeConcatLayer(this,layer);
  }
  else if (LVar1 == kSplit) {
    shapeSplitLayer(this,layer);
  }
  else if (LVar1 == kSequenceRepeat) {
    shapeSequenceRepeatLayer(this,layer);
  }
  else if (LVar1 == kReorganizeData) {
    shapeReorganizeDataLayer(this,layer);
  }
  else if (LVar1 == kSlice) {
    shapeSliceLayer(this,layer);
  }
  else if (LVar1 == kSimpleRecurrent) {
    shapeSimpleRecurrentLayer(this,layer);
  }
  else if (LVar1 == kGru) {
    shapeGRULayer(this,layer);
  }
  else if (LVar1 == kUniDirectionalLSTM) {
    shapeUnidirectionalLSTMLayer(this,layer);
  }
  else if (LVar1 == kBiDirectionalLSTM) {
    shapeBidirectionalLSTMLayer(this,layer);
  }
  else {
    if (LVar1 != kCustom) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Shape inference not implemented for this layer type.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    shapeCustomLayer(this,layer);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::ProcessLayer(const Specification::NeuralNetworkLayer& layer) {

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::kConvolution:
            shapeConvolutionLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kPooling:
            shapePoolingLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kActivation:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kInnerProduct:
            shapeInnerProductLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kEmbedding:
            shapeEmbeddingLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kBatchnorm:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kMvn:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kL2Normalize:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kSoftmax:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kLrn:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kCrop:
            shapeCropLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kPadding:
            shapePaddingLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kUpsample:
            shapeUpsampleLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kUnary:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kAdd:
            shapeBroadcastLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kMultiply:
            shapeBroadcastLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kAverage:
            shapeBroadcastLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kScale:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kBias:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kMax:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kMin:
            shapeUnchanged(layer);
            break;
        case Specification::NeuralNetworkLayer::kDot:
            shapeDotLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kReduce:
            shapeReduceLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kLoadConstant:
            shapeLoadConstantLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kReshape:
            shapeReshapeLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kFlatten:
            shapeFlattenLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kPermute:
            shapePermuteLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kConcat:
            shapeConcatLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kSplit:
            shapeSplitLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kSequenceRepeat:
            shapeSequenceRepeatLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kReorganizeData:
            shapeReorganizeDataLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kSlice:
            shapeSliceLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kSimpleRecurrent:
            shapeSimpleRecurrentLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kGru:
            shapeGRULayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kUniDirectionalLSTM:
            shapeUnidirectionalLSTMLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kBiDirectionalLSTM:
            shapeBidirectionalLSTMLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kCustom:
            shapeCustomLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kResizeBilinear:
            shapeResizeBilinearLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::kCropResize:
            shapeCropResizeLayer(layer);
            break;
        case Specification::NeuralNetworkLayer::LAYER_NOT_SET:
            throw std::runtime_error("Layer type not found.");
            break;
        default:
            throw std::runtime_error("Shape inference not implemented for this layer type.");
            break;
    }
}